

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O2

void JSONWorker::DoNode(internalJSONNode *parent,json_string *value_t)

{
  pointer pcVar1;
  size_t pos;
  size_t sVar2;
  json_string local_70;
  json_string name;
  
  if (*(value_t->_M_dataplus)._M_p == '{') {
    if (2 < value_t->_M_string_length) {
      pos = FindNextRelevant<(char)58>(value_t,1);
      if (pos == 0xffffffffffffffff) goto LAB_00127b0e;
      pcVar1 = (value_t->_M_dataplus)._M_p;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&name,pcVar1 + 1,pcVar1 + (pos - 1));
      sVar2 = FindNextRelevant<(char)44>(value_t,pos);
      while (sVar2 != 0xffffffffffffffff) {
        pcVar1 = (value_t->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_70,pcVar1 + pos + 1,pcVar1 + sVar2);
        NewNode(parent,&name,&local_70,false);
        std::__cxx11::string::~string((string *)&local_70);
        pos = FindNextRelevant<(char)58>(value_t,sVar2 + 1);
        if (pos == 0xffffffffffffffff) {
          internalJSONNode::Nullify(parent);
          goto LAB_00127aeb;
        }
        pcVar1 = (value_t->_M_dataplus)._M_p;
        std::__cxx11::string::
        assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)&name,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(pcVar1 + sVar2 + 1),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(pcVar1 + (pos - 1)));
        sVar2 = FindNextRelevant<(char)44>(value_t,pos);
      }
      pcVar1 = (value_t->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_70,pcVar1 + pos + 1,pcVar1 + (value_t->_M_string_length - 1));
      NewNode(parent,&name,&local_70,false);
      std::__cxx11::string::~string((string *)&local_70);
LAB_00127aeb:
      std::__cxx11::string::~string((string *)&name);
    }
    return;
  }
LAB_00127b0e:
  internalJSONNode::Nullify(parent);
  return;
}

Assistant:

void JSONWorker::DoNode(const internalJSONNode * parent, const json_string & value_t) json_nothrow {	
	//This take a node and creates its members and such
	JSON_ASSERT(!value_t.empty(), JSON_TEXT("DoNode is empty"));
	JSON_ASSERT_SAFE(value_t[0] == JSON_TEXT('{'), JSON_TEXT("DoNode is not an node"), parent -> Nullify(); return;);
	if (json_unlikely(value_t.length() <= 2)) return;  // just a {} (blank node)
	
	size_t name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, 1);  //find where the name ends
	JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
	json_string name(value_t.begin() + 1, value_t.begin() + name_ending - 1);	  //pull the name out
	for (size_t value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending),  //find the end of the value
		 name_starting = 1;  //ignore the {
		 value_ending != json_string::npos;
		 value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending)){
		
		NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.begin() + value_ending), false);
		name_starting = value_ending + 1;
		name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, name_starting);
		JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
		name.assign(value_t.begin() + name_starting, value_t.begin() + name_ending - 1);
	}
	//since the last one will not find the comma, we have to add it here
	NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.end() - 1), false);
}